

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O2

void __thiscall
Assimp::IFC::Schema_2x3::IfcSimpleProperty::~IfcSimpleProperty(IfcSimpleProperty *this)

{
  IfcProperty::~IfcProperty(&this->super_IfcProperty,&PTR_construction_vtable_24__00732ac0);
  return;
}

Assistant:

IfcSimpleProperty() : Object("IfcSimpleProperty") {}